

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O2

void xvec_erase(xvec_t *xv,size_t pos,int count)

{
  ulong uVar1;
  uchar *__src;
  size_t sVar2;
  uchar *puVar3;
  size_t sVar4;
  
  if (-1 < count) {
    uVar1 = (uint)count + pos;
    if (uVar1 < xv->size) {
      sVar4 = xv->size - (ulong)(uint)count;
      xv->size = sVar4;
      if (xv->destroy_cb == (xvec_destroy_cb)0x0) {
        sVar2 = xv->val_size;
        puVar3 = xv->data;
        __src = puVar3 + uVar1 * sVar2;
      }
      else {
        __src = (uchar *)values_destroy(xv,pos,count);
        puVar3 = xv->data;
        sVar4 = xv->size;
        sVar2 = xv->val_size;
      }
      memmove(puVar3 + sVar2 * pos,__src,(sVar4 - pos) * sVar2);
      return;
    }
  }
  if (xv->destroy_cb != (xvec_destroy_cb)0x0) {
    values_destroy(xv,pos,(int)xv->size - (int)pos);
  }
  xv->size = pos;
  return;
}

Assistant:

void xvec_erase(xvec_t* xv, size_t pos, int count)
{
    unsigned char* v;

    if (count < 0 || pos + count >= xv->size)
    {
        if (xv->destroy_cb)
            values_destroy(xv, pos, xv->size - pos);

        xv->size = pos;
    }
    else
    {
        xv->size -= count;

        if (xv->destroy_cb)
            v = values_destroy(xv, pos, count);
        else
            v = xvec_at(xv, pos + count);

        /* <<< */
        memmove(xvec_at(xv, pos), v,
                xv->val_size * (xv->size - pos));
    }
}